

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar5.c
# Opt level: O1

void test_read_format_rar5_data_ready_pointer_leak(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *a;
  archive_entry *ae;
  char buf [4096];
  archive_entry *local_1030;
  undefined1 local_1028 [4104];
  
  extract_reference_file("test_read_format_rar5_data_ready_pointer_leak.rar");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ֆ',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ֆ',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ֆ',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",a);
  wVar2 = archive_read_open_filename(a,"test_read_format_rar5_data_ready_pointer_leak.rar",0x2800);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ֆ',(uint)(wVar2 == L'\0'),
                   "0 == archive_read_open_filename(a, \"test_read_format_rar5_data_ready_pointer_leak.rar\", 10240)"
                   ,a);
  archive_read_next_header((archive *)a,&local_1030);
  archive_read_data((archive *)a,local_1028,0x1000);
  archive_read_next_header((archive *)a,&local_1030);
  archive_read_data((archive *)a,local_1028,0x1000);
  archive_read_data((archive *)a,local_1028,0x1000);
  archive_read_next_header((archive *)a,&local_1030);
  archive_read_data((archive *)a,local_1028,0x1000);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'֕',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'֕',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_rar5_data_ready_pointer_leak)
{
	/* oss fuzz 70024 */

	char buf[4096];
	PROLOGUE("test_read_format_rar5_data_ready_pointer_leak.rar");

	/* Return codes of those calls are ignored, because this sample file
	 * is invalid. However, the unpacker shouldn't produce any SIGSEGV
	 * errors during processing. */

	(void) archive_read_next_header(a, &ae);
	(void) archive_read_data(a, buf, sizeof(buf));
	(void) archive_read_next_header(a, &ae);
	(void) archive_read_data(a, buf, sizeof(buf));
	(void) archive_read_data(a, buf, sizeof(buf));
	(void) archive_read_next_header(a, &ae);
	/* This call shouldn't produce SIGSEGV. */
	(void) archive_read_data(a, buf, sizeof(buf));

	EPILOGUE();
}